

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O2

double result(string *str)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double local_b0;
  double local_a8;
  string tok;
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>(&temp);
  while( true ) {
    lVar3 = std::__cxx11::string::find((char)str,0x20);
    if (lVar3 == -1) break;
    std::__cxx11::string::substr((ulong)&tok,(ulong)str);
    bVar1 = is_num(&tok);
    if (bVar1) {
      iVar2 = std::__cxx11::stoi(&tok,(size_t *)0x0,10);
      local_b0 = (double)iVar2;
      std::deque<double,_std::allocator<double>_>::emplace_back<double>(&temp.c,&local_b0);
    }
    else {
      local_b0 = do_oper(&temp,*tok._M_dataplus._M_p);
      std::deque<double,_std::allocator<double>_>::emplace_back<double>(&temp.c,&local_b0);
    }
    std::__cxx11::string::erase((ulong)str,0);
    std::__cxx11::string::~string((string *)&tok);
  }
  tok._M_dataplus._M_p = (pointer)do_oper(&temp,*(str->_M_dataplus)._M_p);
  std::deque<double,_std::allocator<double>_>::emplace_back<double>(&temp.c,(double *)&tok);
  if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_first) {
    temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur =
         temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_node[-1] + 0x40;
  }
  local_a8 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur[-1];
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)&temp);
  return local_a8;
}

Assistant:

double result (string str) {
    stack<double> temp;
    size_t pos = 0;
    while ((pos = str.find(' ')) != string::npos){
        string tok = str.substr(0, pos);
        if (is_num(tok)) temp.push(stoi(tok));
        else temp.push(do_oper(temp, tok[0]));
        str.erase(0, pos + 1);
    }
    temp.push(do_oper(temp, str[0]));
    return temp.top();
}